

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindow * ImGui::DockNodeFindWindowByID(ImGuiDockNode *node,ImGuiID id)

{
  ImGuiWindow **ppIVar1;
  int local_20;
  int n;
  ImGuiID id_local;
  ImGuiDockNode *node_local;
  
  if (id == 0) {
    __assert_fail("id != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                  ,0x327d,"ImGuiWindow *ImGui::DockNodeFindWindowByID(ImGuiDockNode *, ImGuiID)");
  }
  local_20 = 0;
  while( true ) {
    if ((node->Windows).Size <= local_20) {
      return (ImGuiWindow *)0x0;
    }
    ppIVar1 = ImVector<ImGuiWindow_*>::operator[](&node->Windows,local_20);
    if ((*ppIVar1)->ID == id) break;
    local_20 = local_20 + 1;
  }
  ppIVar1 = ImVector<ImGuiWindow_*>::operator[](&node->Windows,local_20);
  return *ppIVar1;
}

Assistant:

static ImGuiWindow* ImGui::DockNodeFindWindowByID(ImGuiDockNode* node, ImGuiID id)
{
    IM_ASSERT(id != 0);
    for (int n = 0; n < node->Windows.Size; n++)
        if (node->Windows[n]->ID == id)
            return node->Windows[n];
    return NULL;
}